

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::opt::GraphicsRobustAccessPass::IsCompatibleModule(GraphicsRobustAccessPass *this)

{
  IRContext *this_00;
  __uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
  this_01;
  bool bVar1;
  uint32_t uVar2;
  long lVar3;
  spv_result_t sVar4;
  char *pcVar5;
  FeatureManager *pFVar6;
  string local_218;
  DiagnosticStream local_1f8;
  CapabilitySet *this_02;
  
  this_00 = (this->super_Pass).context_;
  pFVar6 = (this_00->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar6 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(this_00);
    pFVar6 = (this_00->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  this_02 = &pFVar6->capabilities_;
  bVar1 = EnumSet<spv::Capability>::contains(this_02,Shader);
  if (bVar1) {
    bVar1 = EnumSet<spv::Capability>::contains(this_02,VariablePointers);
    if (bVar1) {
      Fail(&local_1f8,this);
      pcVar5 = "Can\'t process modules with VariablePointers capability";
      lVar3 = 0x36;
    }
    else {
      bVar1 = EnumSet<spv::Capability>::contains(this_02,VariablePointersStorageBuffer);
      if (bVar1) {
        Fail(&local_1f8,this);
        pcVar5 = "Can\'t process modules with VariablePointersStorageBuffer capability";
        lVar3 = 0x43;
      }
      else {
        bVar1 = EnumSet<spv::Capability>::contains(this_02,RuntimeDescriptorArray);
        if (!bVar1) {
          this_01.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
               (((((this->super_Pass).context_)->module_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                 .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->memory_model_
               )._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ;
          uVar2 = Instruction::GetSingleWordOperand
                            ((Instruction *)
                             this_01.
                             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                             _M_head_impl,0);
          if (uVar2 == 0) {
            return SPV_SUCCESS;
          }
          Fail(&local_1f8,this);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f8,"Addressing model must be Logical.  Found ",0x29);
          Instruction::PrettyPrint_abi_cxx11_
                    (&local_218,
                     (Instruction *)
                     this_01.
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1f8,local_218._M_dataplus._M_p,local_218._M_string_length);
          sVar4 = local_1f8.error_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          goto LAB_002179af;
        }
        Fail(&local_1f8,this);
        pcVar5 = "Can\'t process modules with RuntimeDescriptorArrayEXT capability";
        lVar3 = 0x3f;
      }
    }
  }
  else {
    Fail(&local_1f8,this);
    pcVar5 = "Can only process Shader modules";
    lVar3 = 0x1f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,pcVar5,lVar3);
  sVar4 = local_1f8.error_;
LAB_002179af:
  DiagnosticStream::~DiagnosticStream(&local_1f8);
  return sVar4;
}

Assistant:

spv_result_t GraphicsRobustAccessPass::IsCompatibleModule() {
  auto* feature_mgr = context()->get_feature_mgr();
  if (!feature_mgr->HasCapability(spv::Capability::Shader))
    return Fail() << "Can only process Shader modules";
  if (feature_mgr->HasCapability(spv::Capability::VariablePointers))
    return Fail() << "Can't process modules with VariablePointers capability";
  if (feature_mgr->HasCapability(
          spv::Capability::VariablePointersStorageBuffer))
    return Fail() << "Can't process modules with VariablePointersStorageBuffer "
                     "capability";
  if (feature_mgr->HasCapability(spv::Capability::RuntimeDescriptorArrayEXT)) {
    // These have a RuntimeArray outside of Block-decorated struct.  There
    // is no way to compute the array length from within SPIR-V.
    return Fail() << "Can't process modules with RuntimeDescriptorArrayEXT "
                     "capability";
  }

  {
    auto* inst = context()->module()->GetMemoryModel();
    const auto addressing_model =
        spv::AddressingModel(inst->GetSingleWordOperand(0));
    if (addressing_model != spv::AddressingModel::Logical)
      return Fail() << "Addressing model must be Logical.  Found "
                    << inst->PrettyPrint();
  }
  return SPV_SUCCESS;
}